

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O1

void __thiscall OpenMD::DumpReader::readSiteData(DumpReader *this,istream *inputStream)

{
  char *__s;
  size_type sVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  string line;
  string local_50;
  
  __s = this->buffer;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,this->buffer + sVar2);
  while( true ) {
    std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
    plVar3 = (long *)std::istream::getline((char *)inputStream,(long)__s,'\0');
    sVar1 = local_50._M_string_length;
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)sVar1,(ulong)__s);
    lVar4 = std::__cxx11::string::find((char *)&local_50,0x296e14,0);
    if (lVar4 != -1) break;
    parseSiteLine(this,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DumpReader::readSiteData(std::istream& inputStream) {
    std::string line(buffer);

    // We already found the starting <SiteData> tag or we wouldn't be
    // here, so just start parsing until we get to the ending
    // </SiteData> tag:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</SiteData>") != std::string::npos) { break; }

      parseSiteLine(line);
    }
  }